

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_types.cpp
# Opt level: O2

ssize_t __thiscall
jaegertracing::sampling_manager::thrift::ProbabilisticSamplingStrategy::read
          (ProbabilisticSamplingStrategy *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  uint local_60;
  TType ftype;
  double *local_58;
  string fname;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&fname);
  local_58 = &this->samplingRate;
  local_60 = 0;
  do {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&fname,&ftype,&fid);
    if (ftype == T_STOP) {
      iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_60 & 1) != 0) {
        std::__cxx11::string::~string((string *)&fname);
        this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
        return (ulong)(uint)(iVar3 + iVar2 + iVar1);
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x30);
      puVar6[1] = puVar6 + 3;
      puVar6[2] = 0;
      *(undefined1 *)(puVar6 + 3) = 0;
      *puVar6 = &PTR__TException_00299728;
      *(undefined4 *)(puVar6 + 5) = 1;
      __cxa_throw(puVar6,&apache::thrift::protocol::TProtocolException::typeinfo,
                  apache::thrift::TException::~TException);
    }
    if (fid == 1) {
      pp_Var5 = this_00->_vptr_TProtocol;
      if (ftype != T_DOUBLE) goto LAB_00236681;
      iVar3 = (*pp_Var5[0x29])(this_00,local_58);
      local_60 = (uint)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
    }
    else {
      pp_Var5 = this_00->_vptr_TProtocol;
LAB_00236681:
      iVar3 = (*pp_Var5[0x2c])(this_00);
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  } while( true );
}

Assistant:

uint32_t ProbabilisticSamplingStrategy::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_samplingRate = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_DOUBLE) {
          xfer += iprot->readDouble(this->samplingRate);
          isset_samplingRate = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_samplingRate)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}